

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

BufferWrapper * buffer_wrapped_lookup(ALuint name)

{
  BufferWrapper *pBVar1;
  
  if ((current_context != (ContextWrapper *)0x0) &&
     (name != 0 && current_context->device != (DeviceWrapper *)0x0)) {
    for (pBVar1 = current_context->device->wrapped_buffer_hash[name & 0xff];
        pBVar1 != (BufferWrapper *)0x0; pBVar1 = pBVar1->hash_next) {
      if (pBVar1->name == name) {
        return pBVar1;
      }
    }
  }
  return (BufferWrapper *)0x0;
}

Assistant:

static BufferWrapper *buffer_wrapped_lookup(const ALuint name)
{
    BufferWrapper *retval = NULL;
    DeviceWrapper *device = current_context ? current_context->device : NULL;
    if (device && name) {
        const uint8 hash = hash_alname(name);
        for (retval = device->wrapped_buffer_hash[hash]; retval; retval = retval->hash_next) {
            if (retval->name == name) {
                break;
            }
        }
    }
    return retval;


}